

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigation.cpp
# Opt level: O0

void __thiscall despot::Navigation::PrintMDPPolicy(Navigation *this)

{
  int iVar1;
  ostream *poVar2;
  const_reference pvVar3;
  void *this_00;
  const_reference ppNVar4;
  int local_14;
  int s;
  Navigation *this_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"MDP (Start)");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_14 = 0;
  while( true ) {
    iVar1 = (**(code **)(*(long *)this + 0xd0))();
    if (iVar1 <= local_14) break;
    poVar2 = std::operator<<((ostream *)&std::cout,"State ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_14);
    poVar2 = std::operator<<(poVar2,"; Action = ");
    pvVar3 = std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::operator[]
                       ((vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *)
                        &this->field_0x10,(long)local_14);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)pvVar3);
    poVar2 = std::operator<<(poVar2,"; Reward = ");
    pvVar3 = std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::operator[]
                       ((vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *)
                        &this->field_0x10,(long)local_14);
    this_00 = (void *)std::ostream::operator<<(poVar2,*(double *)(pvVar3 + 8));
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    ppNVar4 = std::vector<despot::NavigationState_*,_std::allocator<despot::NavigationState_*>_>::
              operator[](&this->states_,(long)local_14);
    (**(code **)(*(long *)this + 0x88))(this,*ppNVar4,&std::cout);
    local_14 = local_14 + 1;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"MDP (End)");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Navigation::PrintMDPPolicy() const {
	cout << "MDP (Start)" << endl;
	for (int s = 0; s < NumStates(); s++) {
		cout << "State " << s << "; Action = " << policy_[s].action
			<< "; Reward = " << policy_[s].value << endl;
		PrintState(*(states_[s]));
	}
	cout << "MDP (End)" << endl;
}